

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.c
# Opt level: O0

int split(char *string,char **fields,int nfields,char *sep)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  char *pcStack_50;
  int trimtrail;
  char *sepp;
  char **fp;
  int fn;
  char sepc2;
  char sepc;
  char c;
  char *p;
  char *sep_local;
  int nfields_local;
  char **fields_local;
  char *string_local;
  
  fp._6_1_ = *sep;
  pcVar5 = string;
  if (fp._6_1_ == '\0') {
    do {
      _fn = pcVar5;
      pcVar5 = _fn + 1;
    } while (*_fn == ' ' || *_fn == '\t');
    bVar2 = true;
    p = " \t";
    fp._6_1_ = ' ';
  }
  else {
    bVar2 = false;
    _fn = string;
    p = sep;
  }
  cVar1 = p[1];
  if (*_fn == '\0') {
    string_local._4_4_ = 0;
  }
  else {
    sepp = (char *)fields;
    fp._0_4_ = nfields;
    if (cVar1 == '\0') {
      while( true ) {
        *(char **)sepp = _fn;
        fp._0_4_ = (int)fp + -1;
        iVar3 = nfields;
        if ((int)fp == 0) break;
        while( true ) {
          cVar1 = *_fn;
          if (cVar1 == fp._6_1_) break;
          _fn = _fn + 1;
          if (cVar1 == '\0') {
            return nfields - (int)fp;
          }
        }
        *_fn = '\0';
        sepp = sepp + 8;
        _fn = _fn + 1;
      }
      do {
        while( true ) {
          fp._0_4_ = iVar3;
          cVar1 = *_fn;
          if (cVar1 != fp._6_1_) break;
          _fn = _fn + 1;
          iVar3 = (int)fp + 1;
        }
        _fn = _fn + 1;
        iVar3 = (int)fp;
      } while (cVar1 != '\0');
      string_local._4_4_ = (int)fp;
    }
    else {
      fp._0_4_ = nfields;
      if (p[2] != '\0') {
        fp._0_4_ = 0;
        do {
          if ((int)fp < nfields) {
            *(char **)sepp = _fn;
            sepp = sepp + 8;
          }
          fp._0_4_ = (int)fp + 1;
          pcVar5 = _fn;
          do {
            _fn = pcVar5;
            pcVar5 = _fn + 1;
            if (*_fn == '\0') {
              return (int)fp;
            }
            pcStack_50 = p;
            do {
              cVar1 = *pcStack_50;
              pcStack_50 = pcStack_50 + 1;
            } while (cVar1 != '\0' && cVar1 != *_fn);
          } while (cVar1 == '\0');
          if ((int)fp < nfields) {
            *_fn = '\0';
          }
          do {
            _fn = pcVar5;
            pcStack_50 = p;
            do {
              cVar1 = *pcStack_50;
              pcStack_50 = pcStack_50 + 1;
            } while (cVar1 != '\0' && cVar1 != *_fn);
            pcVar5 = _fn + 1;
          } while (cVar1 != '\0');
        } while( true );
      }
      while( true ) {
        pcVar5 = sepp + 8;
        *(char **)sepp = _fn;
        iVar3 = (int)fp + -1;
        while( true ) {
          pcVar4 = _fn + 1;
          fp._7_1_ = *_fn;
          if (fp._7_1_ == fp._6_1_ || fp._7_1_ == cVar1) break;
          _fn = pcVar4;
          if (fp._7_1_ == '\0') {
            if ((bVar2) && (**(char **)sepp == '\0')) {
              iVar3 = (int)fp;
            }
            fp._0_4_ = iVar3;
            return nfields - (int)fp;
          }
        }
        fp._0_4_ = nfields;
        if (iVar3 == 0) break;
        *_fn = '\0';
        do {
          _fn = pcVar4;
          sepp = pcVar5;
          fp._0_4_ = iVar3;
          pcVar4 = _fn + 1;
        } while (*_fn == fp._6_1_ || *_fn == cVar1);
      }
      while (_fn = pcVar4, pcVar5 = _fn, fp._7_1_ != '\0') {
        do {
          _fn = pcVar5;
          pcVar5 = _fn + 1;
        } while (*_fn == fp._6_1_ || *_fn == cVar1);
        fp._0_4_ = (int)fp + 1;
        do {
          fp._7_1_ = *_fn;
          bVar6 = false;
          if ((fp._7_1_ != '\0') && (bVar6 = false, fp._7_1_ != fp._6_1_)) {
            bVar6 = fp._7_1_ != cVar1;
          }
          pcVar4 = _fn + 1;
          _fn = _fn + 1;
        } while (bVar6);
      }
      if (bVar2) {
        do {
          _fn = pcVar5 + -1;
          pcVar4 = pcVar5 + -2;
          pcVar5 = _fn;
        } while (*pcVar4 == fp._6_1_ || *pcVar4 == cVar1);
        if (*_fn != '\0') {
          if ((int)fp == nfields + 1) {
            *_fn = '\0';
          }
          fp._0_4_ = (int)fp + -1;
        }
      }
      string_local._4_4_ = (int)fp;
    }
  }
  return string_local._4_4_;
}

Assistant:

int				/* number of fields, including overflow */
split(string, fields, nfields, sep)
char *string;
char *fields[];			/* list is not NULL-terminated */
int nfields;			/* number of entries available in fields[] */
char *sep;			/* "" white, "c" single char, "ab" [ab]+ */
{
	register char *p = string;
	register char c;			/* latest character */
	register char sepc = sep[0];
	register char sepc2;
	register int fn;
	register char **fp = fields;
	register char *sepp;
	register int trimtrail;

	/* white space */
	if (sepc == '\0') {
		while ((c = *p++) == ' ' || c == '\t')
			continue;
		p--;
		trimtrail = 1;
		sep = " \t";	/* note, code below knows this is 2 long */
		sepc = ' ';
	} else
		trimtrail = 0;
	sepc2 = sep[1];		/* now we can safely pick this up */

	/* catch empties */
	if (*p == '\0')
		return(0);

	/* single separator */
	if (sepc2 == '\0') {
		fn = nfields;
		for (;;) {
			*fp++ = p;
			fn--;
			if (fn == 0)
				break;
			while ((c = *p++) != sepc)
				if (c == '\0')
					return(nfields - fn);
			*(p-1) = '\0';
		}
		/* we have overflowed the fields vector -- just count them */
		fn = nfields;
		for (;;) {
			while ((c = *p++) != sepc)
				if (c == '\0')
					return(fn);
			fn++;
		}
		/* not reached */
	}

	/* two separators */
	if (sep[2] == '\0') {
		fn = nfields;
		for (;;) {
			*fp++ = p;
			fn--;
			while ((c = *p++) != sepc && c != sepc2)
				if (c == '\0') {
					if (trimtrail && **(fp-1) == '\0')
						fn++;
					return(nfields - fn);
				}
			if (fn == 0)
				break;
			*(p-1) = '\0';
			while ((c = *p++) == sepc || c == sepc2)
				continue;
			p--;
		}
		/* we have overflowed the fields vector -- just count them */
		fn = nfields;
		while (c != '\0') {
			while ((c = *p++) == sepc || c == sepc2)
				continue;
			p--;
			fn++;
			while ((c = *p++) != '\0' && c != sepc && c != sepc2)
				continue;
		}
		/* might have to trim trailing white space */
		if (trimtrail) {
			p--;
			while ((c = *--p) == sepc || c == sepc2)
				continue;
			p++;
			if (*p != '\0') {
				if (fn == nfields+1)
					*p = '\0';
				fn--;
			}
		}
		return(fn);
	}

	/* n separators */
	fn = 0;
	for (;;) {
		if (fn < nfields)
			*fp++ = p;
		fn++;
		for (;;) {
			c = *p++;
			if (c == '\0')
				return(fn);
			sepp = sep;
			while ((sepc = *sepp++) != '\0' && sepc != c)
				continue;
			if (sepc != '\0')	/* it was a separator */
				break;
		}
		if (fn < nfields)
			*(p-1) = '\0';
		for (;;) {
			c = *p++;
			sepp = sep;
			while ((sepc = *sepp++) != '\0' && sepc != c)
				continue;
			if (sepc == '\0')	/* it wasn't a separator */
				break;
		}
		p--;
	}

	/* not reached */
}